

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

double extract_spC<PredictionData<float,int>>
                 (PredictionData<float,_int> *prediction_data,size_t row,size_t col_num)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  piVar1 = prediction_data->Xc_ind;
  lVar6 = (long)prediction_data->Xc_indptr[col_num];
  lVar4 = (long)prediction_data->Xc_indptr[col_num + 1];
  piVar2 = piVar1 + lVar6;
  uVar3 = lVar4 * 4 + lVar6 * -4 >> 2;
  while (0 < (long)uVar3) {
    uVar7 = uVar3 >> 1;
    uVar5 = ~uVar7 + uVar3;
    uVar3 = uVar7;
    if ((ulong)(long)piVar2[uVar7] < row) {
      piVar2 = piVar2 + uVar7 + 1;
      uVar3 = uVar5;
    }
  }
  dVar8 = 0.0;
  if ((piVar2 != piVar1 + lVar4) && (*piVar2 == (int)row)) {
    dVar8 = (double)*(float *)((long)prediction_data->Xc + ((long)piVar2 - (long)piVar1));
  }
  return dVar8;
}

Assistant:

double extract_spC(const PredictionData &prediction_data, size_t row, size_t col_num) noexcept
{
    const decltype(prediction_data.Xc_indptr)
               search_res = std::lower_bound(prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num],
                                             prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1],
                                             row);
    if (
        search_res == (prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1])
            ||
        (*search_res) != static_cast<typename std::remove_pointer<decltype(search_res)>::type>(row)
        )
        return 0.;
    else
        return prediction_data.Xc[search_res - prediction_data.Xc_ind];
}